

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.hpp
# Opt level: O2

void __thiscall
antlr::MismatchedTokenException::~MismatchedTokenException(MismatchedTokenException *this)

{
  ~MismatchedTokenException(this);
  operator_delete(this,200);
  return;
}

Assistant:

~MismatchedTokenException() throw() {}